

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O3

int handle_frame(int fd,long currcms)

{
  byte *pbVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  __suseconds_t _Var5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  __u8 *p_Var10;
  long lVar11;
  int iVar12;
  canid_t *pcVar13;
  canfd_frame *pcVar14;
  char *__s;
  long lVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  canfd_frame cf;
  canid_t local_70;
  byte local_6c;
  __u8 a_Stack_68 [64];
  
  bVar18 = 0;
  uVar6 = read(fd,&local_70,0x48);
  if ((int)(uint)uVar6 < 0) {
    __s = "raw read";
LAB_001023b2:
    perror(__s);
    return 0;
  }
  uVar9 = (uint)uVar6 & 0x7fffffff;
  if ((uVar9 != 0x10) && (uVar9 != 0x48)) {
    printf("received strange frame data length %d!\n",uVar6 & 0xffffffff);
    return 0;
  }
  if (canfd_mode == 2) {
    if (uVar9 == 0x10) {
      canfd_mode = 0;
      max_dlen = '\0';
      name_sep = 0;
      print_ascii = 1;
    }
    else {
      canfd_mode = 1;
    }
  }
  else {
    if (uVar9 == 0x48 && canfd_mode == 0) {
      return 1;
    }
    if (uVar9 == 0x10 && canfd_mode == 1) {
      return 1;
    }
  }
  if ((int)local_70 < 0 && (print_eff & 1) == 0) {
    print_eff = 1;
    clearscreen = 0;
  }
  if (0 < idx) {
    p_Var10 = sniftab[0].current.data;
    uVar6 = 0;
    do {
      if (((canfd_frame *)(p_Var10 + -8))->can_id == local_70) {
        if (local_6c != p_Var10[-4]) {
          bVar16 = true;
          goto LAB_001022b2;
        }
        if ((ulong)local_6c != 0) {
          lVar7 = 0;
          goto LAB_0010228d;
        }
        bVar16 = false;
        goto LAB_001022b2;
      }
      uVar6 = uVar6 + 1;
      p_Var10 = p_Var10 + 0x158;
    } while ((uint)idx != uVar6);
    if (0x7ff < idx) {
      __s = "number of different CAN IDs exceeded MAX_SLOTS";
      goto LAB_001023b2;
    }
  }
  bVar17 = true;
  bVar16 = true;
  iVar12 = idx;
  idx = idx + 1;
  goto LAB_001022b4;
  while( true ) {
    p_Var10 = p_Var10 + 1;
    bVar17 = (ulong)local_6c - 1 == lVar7;
    lVar7 = lVar7 + 1;
    if (bVar17) break;
LAB_0010228d:
    bVar16 = a_Stack_68[lVar7] != *p_Var10;
    if (bVar16) break;
  }
LAB_001022b2:
  bVar17 = false;
  iVar12 = (int)uVar6;
LAB_001022b4:
  lVar7 = (long)iVar12;
  lVar8 = lVar7 * 0x158;
  if (sniftab[lVar7].laststamp.tv_sec == 0) {
    if (sniftab[lVar7].laststamp.tv_usec != 0 && !bVar16) goto LAB_0010237f;
  }
  else if (!bVar16) goto LAB_0010237f;
  uVar3 = *(undefined4 *)((long)&sniftab[lVar7].currstamp.tv_sec + 4);
  _Var5 = sniftab[lVar7].currstamp.tv_usec;
  uVar4 = *(undefined4 *)((long)&sniftab[lVar7].currstamp.tv_usec + 4);
  *(int *)&sniftab[lVar7].laststamp.tv_sec = (int)sniftab[lVar7].currstamp.tv_sec;
  *(undefined4 *)((long)&sniftab[lVar7].laststamp.tv_sec + 4) = uVar3;
  *(int *)&sniftab[lVar7].laststamp.tv_usec = (int)_Var5;
  *(undefined4 *)((long)&sniftab[lVar7].laststamp.tv_usec + 4) = uVar4;
  lVar15 = 0;
  ioctl(fd,0x8906,lVar8 + 0x1061a8);
  pcVar13 = &local_70;
  pcVar14 = &sniftab[lVar7].current;
  for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
    uVar2 = *(undefined8 *)pcVar13;
    pcVar14->can_id = (int)uVar2;
    pcVar14->len = (char)((ulong)uVar2 >> 0x20);
    pcVar14->flags = (char)((ulong)uVar2 >> 0x28);
    pcVar14->__res0 = (char)((ulong)uVar2 >> 0x30);
    pcVar14->__res1 = (char)((ulong)uVar2 >> 0x38);
    pcVar13 = pcVar13 + ((ulong)bVar18 * -2 + 1) * 2;
    pcVar14 = (canfd_frame *)((long)pcVar14 + ((ulong)bVar18 * -2 + 1) * 8);
  }
  lVar11 = 8;
  if (max_dlen != '\0') {
    lVar11 = 0x40;
  }
  do {
    pbVar1 = (byte *)(lVar8 + 0x106250 + lVar15);
    *pbVar1 = *pbVar1 | *(byte *)(lVar8 + 0x1061c0 + lVar15) ^ *(byte *)(lVar8 + 0x106208 + lVar15);
    lVar15 = lVar15 + 1;
  } while (lVar11 != lVar15);
  lVar8 = currcms + timeout;
  if (timeout == 0) {
    lVar8 = 0;
  }
  sniftab[lVar7].timeout = lVar8;
  uVar9 = sniftab[lVar7].flags;
  if ((uVar9 & 2) == 0) {
    clearscreen = 0;
  }
  sniftab[lVar7].flags = uVar9 | 6;
LAB_0010237f:
  if (bVar17) {
    qsort(sniftab,(long)idx,0x158,comp);
  }
  return 1;
}

Assistant:

int handle_frame(int fd, long currcms)
{
	bool rx_changed = false;
	bool run_qsort = false;
	int nbytes, i, pos;
	struct canfd_frame cf;

	nbytes = read(fd, &cf, sizeof(cf));
	if (nbytes < 0) {
		perror("raw read");
		return 0; /* quit */
	}

	if ((nbytes != CAN_MTU) && (nbytes != CANFD_MTU)) {
		printf("received strange frame data length %d!\n", nbytes);
		return 0; /* quit */
	}

	/* CAN FD auto mode: switch based on first reception */
	if (canfd_mode == CANFD_AUTO) {
		if (nbytes == CAN_MTU) {
			canfd_mode = CANFD_OFF;
			/* change back auto defaults for Classical CAN */
			max_dlen = CAN_MAX_DLEN;
			name_sep = CC_SEP;
			print_ascii = 1;
		} else {
			canfd_mode = CANFD_ON;
		}
	}

	/* filter for Classical CAN */
	if ((canfd_mode == CANFD_OFF) && (nbytes == CANFD_MTU))
		return 1; /* skip handling */

	/* filter for CAN FD */
	if ((canfd_mode == CANFD_ON) && (nbytes == CAN_MTU))
		return 1; /* skip handling */

	if (!print_eff && (cf.can_id & CAN_EFF_FLAG)) {
		print_eff = 1;
		clearscreen = 1;
	}

	pos = sniftab_index(cf.can_id);
	if (pos < 0) {
		/* CAN ID not existing */
		if (idx >= MAX_SLOTS) {
			/* informative exit */
			perror("number of different CAN IDs exceeded MAX_SLOTS");
			return 0; /* quit */
		}
		/* assign new slot */
		pos = idx++;
		rx_changed = true;
		run_qsort = true;
	}
	else {
		if (cf.len == sniftab[pos].current.len)
			for (i = 0; i < cf.len; i++) {
				if (cf.data[i] != sniftab[pos].current.data[i] ) {
					rx_changed = true;
					break;
				}
			}
		else
			rx_changed = true;
	}

	/* print received frame even if the data didn't change to get a gap time */
	if ((sniftab[pos].laststamp.tv_sec == 0) && (sniftab[pos].laststamp.tv_usec == 0))
		rx_changed = true;

	if (rx_changed == true) {
		sniftab[pos].laststamp = sniftab[pos].currstamp;
		ioctl(fd, SIOCGSTAMP, &sniftab[pos].currstamp);

		sniftab[pos].current = cf;
		for (i = 0; i < max_dlen; i++)
			sniftab[pos].marker.data[i] |= sniftab[pos].current.data[i] ^ sniftab[pos].last.data[i];

		sniftab[pos].timeout = (timeout)?(currcms + timeout):0;

		if (is_clr(pos, DISPLAY))
			clearscreen = 1; /* new entry -> new drawing */

		do_set(pos, DISPLAY);
		do_set(pos, UPDATE);
	}

	if (run_qsort == true)
		qsort(sniftab, idx, sizeof(sniftab[0]), comp);

	return 1; /* ok */
}